

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::anon_unknown_160::CompositeVariantRec
               (uint32_t depth,PrimSpec *primspec,string *warn,string *err)

{
  bool bVar1;
  ostream *poVar2;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *this;
  reference primspec_00;
  undefined1 local_778 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variant_selection;
  PrimSpec dst;
  PrimSpec *child;
  iterator __end2;
  iterator __begin2;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *__range2;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  string *err_local;
  string *warn_local;
  PrimSpec *primspec_local;
  uint32_t depth_local;
  
  if (depth < 0x100001) {
    this = PrimSpec::children(primspec);
    __end2 = ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::begin
                       ((vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *)this);
    child = (PrimSpec *)
            ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::end
                      ((vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                                       *)&child), bVar1) {
      primspec_00 = __gnu_cxx::
                    __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
                    ::operator*(&__end2);
      bVar1 = CompositeVariantRec(depth + 1,primspec_00,warn,err);
      if (!bVar1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<tinyusdz::PrimSpec_*,_std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>_>
      ::operator++(&__end2);
    }
    PrimSpec::PrimSpec((PrimSpec *)
                       &variant_selection._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_778);
    primspec_local._7_1_ =
         VariantSelectPrimSpec
                   ((PrimSpec *)&variant_selection._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    primspec,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_778,warn,err);
    if (primspec_local._7_1_) {
      PrimSpec::operator=(primspec,(PrimSpec *)
                                   &variant_selection._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count);
    }
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_778);
    PrimSpec::~PrimSpec((PrimSpec *)
                        &variant_selection._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"CompositeVariantRec");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3a1);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a0,"Too deep.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,(string *)&__range2);
      ::std::__cxx11::string::~string((string *)&__range2);
    }
    primspec_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return primspec_local._7_1_;
}

Assistant:

bool CompositeVariantRec(uint32_t depth, PrimSpec &primspec /* [inout] */,
                         std::string *warn, std::string *err) {
  if (depth > (1024 * 1024)) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositeVariantRec(depth + 1, child, warn, err)) {
      return false;
    }
  }

  PrimSpec dst;
  std::map<std::string, std::string>
      variant_selection;  // empty = use variant settings in PrimSpec.

  if (!VariantSelectPrimSpec(dst, primspec, variant_selection, warn, err)) {
    return false;
  }

  primspec = std::move(dst);

  return true;
}